

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int libssh2_knownhost_readfile(LIBSSH2_KNOWNHOSTS *hosts,char *filename,int type)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t len;
  int iVar3;
  LIBSSH2_SESSION *session;
  int iStack_1030;
  char buf [4092];
  
  if (type == 1) {
    __stream = fopen(filename,"r");
    if (__stream != (FILE *)0x0) {
      iVar3 = 0;
      do {
        pcVar2 = fgets(buf,0xffc,__stream);
        if (pcVar2 == (char *)0x0) {
LAB_0011a4e1:
          fclose(__stream);
          return iVar3;
        }
        len = strlen(buf);
        iVar1 = libssh2_knownhost_readline(hosts,buf,len,1);
        if (iVar1 != 0) {
          iVar3 = _libssh2_error(hosts->session,-0x2e,"Failed to parse known hosts file");
          goto LAB_0011a4e1;
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
    session = hosts->session;
    pcVar2 = "Failed to open file";
    iStack_1030 = -0x10;
  }
  else {
    session = hosts->session;
    pcVar2 = "Unsupported type of known-host information store";
    iStack_1030 = -0x21;
  }
  iVar3 = _libssh2_error(session,iStack_1030,pcVar2);
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_readfile(LIBSSH2_KNOWNHOSTS *hosts,
                           const char *filename, int type)
{
    FILE *file;
    int num = 0;
    char buf[4092];

    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    file = fopen(filename, FOPEN_READTEXT);
    if(file) {
        while(fgets(buf, sizeof(buf), file)) {
            if(libssh2_knownhost_readline(hosts, buf, strlen(buf), type)) {
                num = _libssh2_error(hosts->session, LIBSSH2_ERROR_KNOWN_HOSTS,
                                     "Failed to parse known hosts file");
                break;
            }
            num++;
        }
        fclose(file);
    }
    else
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                              "Failed to open file");

    return num;
}